

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::Parser::parse_in_place(Parser *this,csubstr file,substr buf,Tree *t,size_t node_id)

{
  State *pSVar1;
  
  (this->m_file).str = file.str;
  (this->m_file).len = file.len;
  (this->m_buf).str = buf.str;
  (this->m_buf).len = buf.len;
  this->m_root_id = node_id;
  this->m_tree = t;
  _reset(this);
  while ((this->m_state->pos).super_LineCol.offset < (this->m_buf).len) {
    _scan_line(this);
    while ((pSVar1 = this->m_state, (pSVar1->line_contents).rem.len != 0 &&
           ((pSVar1->line_contents).rem.str != (char *)0x0))) {
      _handle_line(this);
    }
    if ((this->m_buf).len <= (pSVar1->pos).super_LineCol.offset) break;
    _line_ended(this);
  }
  _end_stream(this);
  return;
}

Assistant:

void Parser::parse_in_place(csubstr file, substr buf, Tree *t, size_t node_id)
{
    m_file = file;
    m_buf = buf;
    m_root_id = node_id;
    m_tree = t;
    _reset();
    while( ! _finished_file())
    {
        _scan_line();
        while( ! _finished_line())
            _handle_line();
        if(_finished_file())
            break; // it may have finished because of multiline blocks
        _line_ended();
    }
    _handle_finished_file();
}